

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGRemoveRedefine
              (xmlRelaxNGParserCtxtPtr ctxt,xmlChar *URL,xmlNodePtr target,xmlChar *name)

{
  _xmlNode *p_Var1;
  void *pvVar2;
  int iVar3;
  xmlChar *value;
  xmlNodePtr pxVar4;
  xmlRelaxNGDocumentPtr_conflict inc;
  xmlChar *href;
  xmlChar *name2;
  xmlNodePtr tmp2;
  xmlNodePtr tmp;
  int found;
  xmlChar *name_local;
  xmlNodePtr target_local;
  xmlChar *URL_local;
  xmlRelaxNGParserCtxtPtr ctxt_local;
  
  tmp._4_4_ = 0;
  p_Var1 = target;
  while (tmp2 = p_Var1, tmp2 != (xmlNodePtr)0x0) {
    p_Var1 = tmp2->next;
    if ((((name == (xmlChar *)0x0) && (tmp2 != (xmlNodePtr)0x0)) && (tmp2->ns != (xmlNs *)0x0)) &&
       (((tmp2->type == XML_ELEMENT_NODE &&
         (iVar3 = xmlStrEqual(tmp2->name,(xmlChar *)"start"), iVar3 != 0)) &&
        (iVar3 = xmlStrEqual(tmp2->ns->href,xmlRelaxNGNs), iVar3 != 0)))) {
      tmp._4_4_ = 1;
      xmlUnlinkNode(tmp2);
      xmlFreeNode(tmp2);
    }
    else if (((name == (xmlChar *)0x0) || (tmp2 == (xmlNodePtr)0x0)) ||
            ((tmp2->ns == (xmlNs *)0x0 ||
             (((tmp2->type != XML_ELEMENT_NODE ||
               (iVar3 = xmlStrEqual(tmp2->name,"define"), iVar3 == 0)) ||
              (iVar3 = xmlStrEqual(tmp2->ns->href,xmlRelaxNGNs), iVar3 == 0)))))) {
      if (((tmp2 != (xmlNodePtr)0x0) && (tmp2->ns != (xmlNs *)0x0)) &&
         ((tmp2->type == XML_ELEMENT_NODE &&
          ((iVar3 = xmlStrEqual(tmp2->name,(xmlChar *)"include"), iVar3 != 0 &&
           (iVar3 = xmlStrEqual(tmp2->ns->href,xmlRelaxNGNs), iVar3 != 0)))))) {
        pvVar2 = tmp2->psvi;
        if ((pvVar2 != (void *)0x0) &&
           (((*(long *)((long)pvVar2 + 0x10) != 0 &&
             (*(long *)(*(long *)((long)pvVar2 + 0x10) + 0x18) != 0)) &&
            (iVar3 = xmlStrEqual(*(xmlChar **)
                                  (*(long *)(*(long *)((long)pvVar2 + 0x10) + 0x18) + 0x10),
                                 "grammar"), iVar3 != 0)))) {
          pxVar4 = xmlDocGetRootElement(*(xmlDoc **)((long)pvVar2 + 0x10));
          iVar3 = xmlRelaxNGRemoveRedefine(ctxt,(xmlChar *)0x0,pxVar4->children,name);
          if (iVar3 == 1) {
            tmp._4_4_ = 1;
          }
        }
        iVar3 = xmlRelaxNGRemoveRedefine(ctxt,URL,tmp2->children,name);
        if (iVar3 == 1) {
          tmp._4_4_ = 1;
        }
      }
    }
    else {
      value = xmlGetProp(tmp2,"name");
      xmlRelaxNGNormExtSpace(value);
      if (value != (xmlChar *)0x0) {
        iVar3 = xmlStrEqual(name,value);
        if (iVar3 != 0) {
          tmp._4_4_ = 1;
          xmlUnlinkNode(tmp2);
          xmlFreeNode(tmp2);
        }
        (*xmlFree)(value);
      }
    }
  }
  return tmp._4_4_;
}

Assistant:

static int
xmlRelaxNGRemoveRedefine(xmlRelaxNGParserCtxtPtr ctxt,
                         const xmlChar * URL ATTRIBUTE_UNUSED,
                         xmlNodePtr target, const xmlChar * name)
{
    int found = 0;
    xmlNodePtr tmp, tmp2;
    xmlChar *name2;

#ifdef DEBUG_INCLUDE
    if (name == NULL)
        xmlGenericError(xmlGenericErrorContext,
                        "Elimination of <include> start from %s\n", URL);
    else
        xmlGenericError(xmlGenericErrorContext,
                        "Elimination of <include> define %s from %s\n",
                        name, URL);
#endif
    tmp = target;
    while (tmp != NULL) {
        tmp2 = tmp->next;
        if ((name == NULL) && (IS_RELAXNG(tmp, "start"))) {
            found = 1;
            xmlUnlinkNode(tmp);
            xmlFreeNode(tmp);
        } else if ((name != NULL) && (IS_RELAXNG(tmp, "define"))) {
            name2 = xmlGetProp(tmp, BAD_CAST "name");
            xmlRelaxNGNormExtSpace(name2);
            if (name2 != NULL) {
                if (xmlStrEqual(name, name2)) {
                    found = 1;
                    xmlUnlinkNode(tmp);
                    xmlFreeNode(tmp);
                }
                xmlFree(name2);
            }
        } else if (IS_RELAXNG(tmp, "include")) {
            xmlChar *href = NULL;
            xmlRelaxNGDocumentPtr inc = tmp->psvi;

            if ((inc != NULL) && (inc->doc != NULL) &&
                (inc->doc->children != NULL)) {

                if (xmlStrEqual
                    (inc->doc->children->name, BAD_CAST "grammar")) {
#ifdef DEBUG_INCLUDE
                    href = xmlGetProp(tmp, BAD_CAST "href");
#endif
                    if (xmlRelaxNGRemoveRedefine(ctxt, href,
                                                 xmlDocGetRootElement(inc->doc)->children,
                                                 name) == 1) {
                        found = 1;
                    }
#ifdef DEBUG_INCLUDE
                    if (href != NULL)
                        xmlFree(href);
#endif
                }
            }
            if (xmlRelaxNGRemoveRedefine(ctxt, URL, tmp->children, name) == 1) {
                found = 1;
            }
        }
        tmp = tmp2;
    }
    return (found);
}